

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

ON_OBSOLETE_V5_TextExtra *
ON_OBSOLETE_V5_TextExtra::TextExtension(ON_OBSOLETE_V5_TextObject *pText,bool bCreate)

{
  bool bVar1;
  ON_UserData *p;
  ON_OBSOLETE_V5_TextExtra *this;
  ON_UUID local_30;
  ON_OBSOLETE_V5_TextExtra *local_20;
  ON_OBSOLETE_V5_TextExtra *pExtra;
  ON_Object *pOStack_10;
  bool bCreate_local;
  ON_OBSOLETE_V5_TextObject *pText_local;
  
  local_20 = (ON_OBSOLETE_V5_TextExtra *)0x0;
  if (pText != (ON_OBSOLETE_V5_TextObject *)0x0) {
    pExtra._7_1_ = bCreate;
    pOStack_10 = (ON_Object *)pText;
    local_30 = ON_ClassId::Uuid(&m_ON_OBSOLETE_V5_TextExtra_class_rtti);
    p = ON_Object::GetUserData((ON_Object *)pText,&local_30);
    local_20 = Cast(&p->super_ON_Object);
    if ((local_20 == (ON_OBSOLETE_V5_TextExtra *)0x0) && ((pExtra._7_1_ & 1) != 0)) {
      this = (ON_OBSOLETE_V5_TextExtra *)operator_new(0xf0);
      ON_OBSOLETE_V5_TextExtra(this);
      local_20 = this;
      if ((this != (ON_OBSOLETE_V5_TextExtra *)0x0) &&
         (bVar1 = ON_Object::AttachUserData(pOStack_10,(ON_UserData *)this), !bVar1)) {
        if (local_20 != (ON_OBSOLETE_V5_TextExtra *)0x0) {
          (*(local_20->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])();
        }
        local_20 = (ON_OBSOLETE_V5_TextExtra *)0x0;
      }
    }
  }
  return local_20;
}

Assistant:

ON_OBSOLETE_V5_TextExtra* ON_OBSOLETE_V5_TextExtra::TextExtension(ON_OBSOLETE_V5_TextObject* pText, bool bCreate)
{
  ON_OBSOLETE_V5_TextExtra* pExtra = 0;
  if(pText)
  {
    pExtra = ON_OBSOLETE_V5_TextExtra::Cast(pText->GetUserData(ON_CLASS_ID(ON_OBSOLETE_V5_TextExtra)));
    if(pExtra == 0 && bCreate)
    {
      pExtra = new ON_OBSOLETE_V5_TextExtra;
      if(pExtra)
      {
        if(!pText->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = 0;
        }
      }
    }
  }
  return pExtra;
}